

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitLocalSet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,LocalSet *curr)

{
  uint uVar1;
  char cVar2;
  Type TVar3;
  undefined1 local_78 [8];
  Flow flow;
  
  uVar1 = curr->index;
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_78,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->value);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    cVar2 = ::wasm::LocalSet::isTee();
    if (cVar2 != '\0') {
      TVar3 = Literals::getType((Literals *)local_78);
      cVar2 = ::wasm::Type::isSubType
                        (TVar3,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)9>).
                                     super_Expression.type.id);
      if (cVar2 == '\0') {
        __assert_fail("curr->isTee() ? Type::isSubType(flow.getType(), curr->type) : true",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0xdfa,
                      "Flow wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitLocalSet(LocalSet *) [SubType = wasm::ModuleRunner]"
                     );
      }
    }
    SmallVector<wasm::Literal,_1UL>::operator=
              (&(this->scope->locals).
                super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1].super_SmallVector<wasm::Literal,_1UL>,
               (SmallVector<wasm::Literal,_1UL> *)local_78);
    cVar2 = ::wasm::LocalSet::isTee();
    if (cVar2 == '\0') {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_78);
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_78);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

Flow visitLocalSet(LocalSet* curr) {
    NOTE_ENTER("LocalSet");
    auto index = curr->index;
    Flow flow = self()->visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(index);
    NOTE_EVAL1(flow.getSingleValue());
    assert(curr->isTee() ? Type::isSubType(flow.getType(), curr->type) : true);
    scope->locals[index] = flow.values;
    return curr->isTee() ? flow : Flow();
  }